

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

json_token * find_json_token(json_token *toks,char *path)

{
  char cVar1;
  int iVar2;
  json_token *in_RAX;
  json_token *pjVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  json_token *pjVar8;
  int i;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  
  do {
    if ((path == (char *)0x0) || (*path == '\0')) {
      return (json_token *)0x0;
    }
    for (uVar10 = 0; ((cVar1 = path[uVar10], cVar1 != '\0' && (cVar1 != '.')) && (cVar1 != '['));
        uVar10 = uVar10 + 1) {
    }
    pcVar7 = path;
    pjVar8 = toks;
    if (*path == '[') {
      if (toks->type != JSON_TYPE_ARRAY) goto LAB_001068d3;
      uVar4 = 0;
      if (0xfffffff5 < (int)path[1] - 0x3aU) {
        for (lVar11 = 1; cVar1 = path[lVar11], cVar1 != '\0'; lVar11 = lVar11 + 1) {
          if (cVar1 == ']') {
            uVar10 = (ulong)((int)lVar11 + 1);
            iVar5 = 1;
            goto LAB_001067eb;
          }
          if (9 < (int)cVar1 - 0x30U) break;
          uVar4 = ((int)cVar1 - 0x30U) + uVar4 * 10;
        }
        goto LAB_001068d3;
      }
      pjVar3 = (json_token *)0x0;
    }
    else {
      if (toks->type == JSON_TYPE_OBJECT) {
        iVar5 = 2;
        uVar4 = 0xffffffff;
LAB_001067eb:
        iVar2 = toks->num_desc;
        pjVar8 = toks + 1;
        iVar9 = (int)uVar10;
        if (iVar2 < 1) {
          iVar12 = 0;
        }
        else {
          uVar6 = 0;
          iVar12 = 0;
          do {
            if ((uVar4 == 0xffffffff) && (toks[(long)iVar12 + 1].type != JSON_TYPE_STRING))
            goto LAB_001068d3;
            if (uVar6 == uVar4) {
LAB_001068c8:
              iVar12 = iVar12 + iVar5 + -1;
              break;
            }
            if ((uVar4 == 0xffffffff) && (toks[(long)iVar12 + 1].len == iVar9)) {
              if (iVar9 < 1) {
                uVar14 = 0;
              }
              else {
                uVar13 = 0;
                do {
                  uVar14 = uVar13;
                  if (path[uVar13] != pjVar8[iVar12].ptr[uVar13]) break;
                  uVar13 = uVar13 + 1;
                  uVar14 = uVar10 & 0xffffffff;
                } while ((uVar10 & 0xffffffff) != uVar13);
              }
              if ((int)uVar14 == iVar9) goto LAB_001068c8;
            }
            lVar11 = (long)(iVar5 + -1 + iVar12);
            if ((toks[lVar11 + 1].type | JSON_TYPE_TRUE) == JSON_TYPE_ARRAY) {
              iVar12 = iVar12 + pjVar8[lVar11].num_desc;
            }
            iVar12 = iVar12 + iVar5;
            uVar6 = uVar6 + 1;
          } while (iVar12 < iVar2);
        }
        if (iVar12 != iVar2) {
          pcVar7 = path + (ulong)(path[iVar9] == '.') + (long)iVar9;
          uVar4 = (uint)(path[(ulong)(path[iVar9] == '.') + (long)iVar9] != '\0');
          pjVar3 = pjVar8 + iVar12;
          if (path[(ulong)(path[iVar9] == '.') + (long)iVar9] != '\0') {
            pjVar3 = in_RAX;
            pjVar8 = pjVar8 + iVar12;
          }
          goto LAB_001068d7;
        }
      }
LAB_001068d3:
      uVar4 = 0;
      pjVar3 = (json_token *)0x0;
    }
LAB_001068d7:
    in_RAX = pjVar3;
    path = pcVar7;
    toks = pjVar8;
    if ((char)uVar4 == '\0') {
      return pjVar3;
    }
  } while( true );
}

Assistant:

struct json_token *find_json_token(struct json_token *toks, const char *path) {
    while (path != 0 && path[0] != '\0') {
        int i, ind2 = 0, ind = -1, skip = 2, n = path_part_len(path);
        if (path[0] == '[') {
            if (toks->type != JSON_TYPE_ARRAY || !is_digit(path[1])) return 0;
            for (ind = 0, n = 1; path[n] != ']' && path[n] != '\0'; n++) {
                if (!is_digit(path[n])) return 0;
                ind *= 10;
                ind += path[n] - '0';
            }
            if (path[n++] != ']') return 0;
            skip = 1;  /* In objects, we skip 2 elems while iterating, in arrays 1. */
        } else if (toks->type != JSON_TYPE_OBJECT) return 0;
        toks++;
        for (i = 0; i < toks[-1].num_desc; i += skip, ind2++) {
            /* ind == -1 indicated that we're iterating an array, not object */
            if (ind == -1 && toks[i].type != JSON_TYPE_STRING) return 0;
            if (ind2 == ind ||
                (ind == -1 && toks[i].len == n && compare(path, toks[i].ptr, n))) {
                i += skip - 1;
                break;
            };
            if (toks[i - 1 + skip].type == JSON_TYPE_ARRAY ||
                toks[i - 1 + skip].type == JSON_TYPE_OBJECT) {
                i += toks[i - 1 + skip].num_desc;
            }
        }
        if (i == toks[-1].num_desc) return 0;
        path += n;
        if (path[0] == '.') path++;
        if (path[0] == '\0') return &toks[i];
        toks += i;
    }
    return 0;
}